

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O0

void __thiscall sfm::FeatureSet::normalize_feature_positions(FeatureSet *this)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Vec2f *pVVar4;
  reference this_00;
  float fVar5;
  Vec2f *pos;
  size_t i;
  float local_18;
  float fnorm;
  float fheight;
  float fwidth;
  FeatureSet *this_local;
  
  fnorm = (float)this->width;
  local_18 = (float)this->height;
  _fheight = this;
  pfVar3 = std::max<float>(&fnorm,&local_18);
  fVar1 = *pfVar3;
  pos = (Vec2f *)0x0;
  while( true ) {
    pVVar4 = (Vec2f *)std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                      ::size(&this->positions);
    if (pVVar4 <= pos) break;
    this_00 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
              operator[](&this->positions,(size_type)pos);
    pfVar3 = math::Vector<float,_2>::operator[](this_00,0);
    fVar2 = *pfVar3;
    fVar5 = fnorm / 2.0;
    pfVar3 = math::Vector<float,_2>::operator[](this_00,0);
    *pfVar3 = ((fVar2 + 0.5) - fVar5) / fVar1;
    pfVar3 = math::Vector<float,_2>::operator[](this_00,1);
    fVar2 = *pfVar3;
    fVar5 = local_18 / 2.0;
    pfVar3 = math::Vector<float,_2>::operator[](this_00,1);
    *pfVar3 = ((fVar2 + 0.5) - fVar5) / fVar1;
    pos = (Vec2f *)((long)pos->v + 1);
  }
  return;
}

Assistant:

void
FeatureSet::normalize_feature_positions (void)
{
    /* Normalize image coordinates. */
    float const fwidth = static_cast<float>(this->width);
    float const fheight = static_cast<float>(this->height);
    float const fnorm = std::max(fwidth, fheight);
    for (std::size_t i = 0; i < this->positions.size(); ++i)
    {
        math::Vec2f& pos = this->positions[i];
        pos[0] = (pos[0] + 0.5f - fwidth / 2.0f) / fnorm;
        pos[1] = (pos[1] + 0.5f - fheight / 2.0f) / fnorm;
    }
}